

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

int stlest_(double *y,int *n,int *len,int *ideg,double *xs,double *ys,int *nleft,int *nright,
           double *w,int *userw,double *rw,int *ok)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar1 = *n;
  dVar6 = pmax(*xs - (double)*nleft,(double)*nright - *xs);
  iVar2 = *len - *n;
  if (iVar2 != 0 && *n <= *len) {
    dVar6 = dVar6 + (double)(iVar2 / 2);
  }
  iVar2 = *nright;
  dVar7 = 0.0;
  for (lVar5 = (long)*nleft; lVar5 <= iVar2; lVar5 = lVar5 + 1) {
    dVar9 = ABS((double)(int)lVar5 - *xs);
    if (dVar9 <= dVar6 * 0.999) {
      dVar8 = 1.0;
      if (dVar6 * 0.001 < dVar9) {
        dVar9 = dVar9 / dVar6;
        dVar8 = 1.0 - dVar9 * dVar9 * dVar9;
        dVar8 = dVar8 * dVar8 * dVar8;
      }
      w[lVar5 + -1] = dVar8;
      if (*userw != 0) {
        dVar8 = dVar8 * rw[lVar5 + -1];
        w[lVar5 + -1] = dVar8;
      }
      dVar7 = dVar7 + dVar8;
    }
    else {
      w[lVar5 + -1] = 0.0;
    }
  }
  if (dVar7 <= 0.0) {
    *ok = 0;
  }
  else {
    *ok = 1;
    lVar3 = (long)*nright;
    lVar4 = (long)*nleft;
    for (lVar5 = lVar4; lVar5 <= lVar3; lVar5 = lVar5 + 1) {
      w[lVar5 + -1] = w[lVar5 + -1] / dVar7;
    }
    if ((0.0 < dVar6) && (0 < *ideg)) {
      dVar6 = 0.0;
      for (lVar5 = lVar4; lVar5 <= lVar3; lVar5 = lVar5 + 1) {
        dVar6 = dVar6 + (double)(int)lVar5 * w[lVar5 + -1];
      }
      dVar7 = *xs;
      dVar9 = 0.0;
      for (; lVar4 <= lVar3; lVar4 = lVar4 + 1) {
        dVar8 = (double)(int)lVar4 - dVar6;
        dVar9 = dVar9 + dVar8 * dVar8 * w[lVar4 + -1];
      }
      if (dVar9 < 0.0) {
        dVar8 = sqrt(dVar9);
      }
      else {
        dVar8 = SQRT(dVar9);
      }
      lVar3 = (long)*nright;
      lVar4 = (long)*nleft;
      if (((double)iVar1 + -1.0) * 0.001 < dVar8) {
        for (lVar5 = lVar4; lVar5 <= lVar3; lVar5 = lVar5 + 1) {
          w[lVar5 + -1] =
               (((double)(int)lVar5 - dVar6) * ((dVar7 - dVar6) / dVar9) + 1.0) * w[lVar5 + -1];
        }
      }
    }
    dVar6 = 0.0;
    *ys = 0.0;
    for (; lVar4 <= lVar3; lVar4 = lVar4 + 1) {
      dVar6 = dVar6 + w[lVar4 + -1] * y[lVar4 + -1];
      *ys = dVar6;
    }
  }
  return 0;
}

Assistant:

int stlest_(double *y, int *n, int *len, int *ideg, double *xs, double *ys, int *nleft, int *
	nright, double *w, int *userw, double *rw, int *ok)
{
    /* System generated locals */
    int i__1;
    double d__1, d__2;


    /* Local variables */
    double a, b, c__, h__;
    int j;
    double r__, h1, h9, range;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --rw;
    --w;
    --y;

    /* Function Body */
    range = (double) (*n) - 1.;
/* Computing MAX */
    d__1 = *xs - (double) (*nleft), d__2 = (double) (*nright) - *xs;
    h__ = pmax(d__1,d__2);
    if (*len > *n) {
	h__ += (double) ((*len - *n) / 2);
    }
    h9 = h__ * .999;
    h1 = h__ * .001;
    a = 0.0;
    i__1 = *nright;
    for (j = *nleft; j <= i__1; ++j) {
	r__ = (d__1 = (double) j - *xs, fabs(d__1));
	if (r__ <= h9) {
	    if (r__ <= h1) {
		w[j] = 1.0;
	    } else {
/* Computing 3rd power */
		d__2 = r__ / h__;
/* Computing 3rd power */
		d__1 = 1.f - d__2 * (d__2 * d__2);
		w[j] = d__1 * (d__1 * d__1);
	    }
	    if (*userw) {
		w[j] = rw[j] * w[j];
	    }
	    a += w[j];
	} else {
	    w[j] = 0.0;
	}
/* L60: */
    }
    if (a <= 0.0) {
	*ok = 0;
    } else {
	*ok = 1;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    w[j] /= a;
/* L69: */
	}
	if (h__ > 0.f && *ideg > 0) {
	    a = 0.f;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
		a += w[j] * (double) j;
/* L73: */
	    }
	    b = *xs - a;
	    c__ = 0.0;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
/* Computing 2nd power */
		d__1 = (double) j - a;
		c__ += w[j] * (d__1 * d__1);
/* L75: */
	    }
	    if (sqrt(c__) > range * .001) {
		b /= c__;
		i__1 = *nright;
		for (j = *nleft; j <= i__1; ++j) {
		    w[j] *= b * ((double) j - a) + 1.0;
/* L79: */
		}
	    }
	}
	*ys = 0.0;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    *ys += w[j] * y[j];
/* L81: */
	}
    }
    return 0;
}